

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O1

int fixupReg(InternalInstruction *insn,OperandSpecifier *op)

{
  byte bVar1;
  uint uVar2;
  EABase EVar3;
  bool bVar4;
  uint8_t valid;
  bool local_19;
  
  bVar1 = op->encoding;
  if (6 < bVar1 - 2) {
    if (bVar1 == 1) {
      bVar1 = fixupRegValue(insn,(uint)op->type,(char)insn->reg - (char)insn->regBase,&local_19);
      insn->reg = (uint)bVar1;
    }
    else {
      if (bVar1 != 9) {
        return -1;
      }
      bVar1 = fixupRegValue(insn,(uint)op->type,(char)insn->vvvv,&local_19);
      insn->vvvv = (uint)bVar1;
    }
    if (local_19 != false) {
      return 0;
    }
    return -1;
  }
  EVar3 = insn->eaBase;
  uVar2 = EVar3 - insn->eaRegBase;
  if (EVar3 < insn->eaRegBase) {
    return 0;
  }
  bVar4 = true;
  bVar1 = (byte)uVar2;
  switch(op->type) {
  case '4':
    EVar3 = (uVar2 & 7) + EA_REG_MM0;
    break;
  case '5':
  case '6':
  case '7':
  case '8':
    EVar3 = uVar2 + EA_REG_XMM0;
    break;
  case '9':
    EVar3 = uVar2 + EA_REG_YMM0;
    break;
  case ':':
    EVar3 = uVar2 + EA_REG_ZMM0;
    break;
  case ';':
  case '>':
  case '?':
    bVar4 = bVar1 < 8;
    EVar3 = uVar2 + EA_REG_K0;
    break;
  case '<':
  case '=':
  case '@':
  case 'A':
  case 'B':
  case 'F':
switchD_0022d4c6_caseD_3c:
    bVar4 = false;
    EVar3 = EA_BASE_NONE;
    break;
  case 'C':
    bVar4 = bVar1 < 6;
    EVar3 = uVar2 + EA_REG_ES;
    break;
  case 'D':
    EVar3 = uVar2 + EA_REG_DR0;
    break;
  case 'E':
    EVar3 = uVar2 + EA_REG_CR0;
    break;
  case 'G':
    break;
  default:
    switch(op->type) {
    case '\b':
      if (((bVar1 & 0xfc) == 4) && (insn->rexPrefix != '\0')) {
        EVar3 = uVar2 + EA_REG_R12B;
      }
      else {
        EVar3 = uVar2 + EA_REG_AL;
      }
      break;
    case '\t':
      EVar3 = uVar2 + EA_REG_AX;
      break;
    case '\n':
      EVar3 = uVar2 + EA_REG_EAX;
      break;
    case '\v':
      EVar3 = uVar2 + EA_REG_RAX;
      break;
    default:
      goto switchD_0022d4c6_caseD_3c;
    }
  }
  insn->eaBase = EVar3 & EA_REG_CR4;
  if (bVar4) {
    return 0;
  }
  return -1;
}

Assistant:

static int fixupReg(struct InternalInstruction *insn,
		const struct OperandSpecifier *op)
{
	uint8_t valid;

	// dbgprintf(insn, "fixupReg()");

	switch ((OperandEncoding)op->encoding) {
		default:
			//debug("Expected a REG or R/M encoding in fixupReg");
			return -1;
		case ENCODING_VVVV:
			insn->vvvv = (Reg)fixupRegValue(insn,
					(OperandType)op->type,
					insn->vvvv,
					&valid);
			if (!valid)
				return -1;
			break;
		case ENCODING_REG:
			insn->reg = (Reg)fixupRegValue(insn,
					(OperandType)op->type,
					(uint8_t)(insn->reg - insn->regBase),
					&valid);
			if (!valid)
				return -1;
			break;
		CASE_ENCODING_RM:
			if (insn->eaBase >= insn->eaRegBase) {
				insn->eaBase = (EABase)fixupRMValue(insn,
						(OperandType)op->type,
						(uint8_t)(insn->eaBase - insn->eaRegBase),
						&valid);
				if (!valid)
					return -1;
			}
			break;
	}

	return 0;
}